

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_config.cc
# Opt level: O0

FlagsUsageConfig * absl::flags_internal::GetUsageConfig(void)

{
  FlagsUsageConfig *in_RDI;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string_view<char,_std::char_traits<char>_>
  *local_48;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  _func_bool_basic_string_view<char,_std::char_traits<char>_> *local_38;
  _func_bool_basic_string_view<char,_std::char_traits<char>_> *local_30;
  _func_bool_basic_string_view<char,_std::char_traits<char>_> *local_28;
  undefined1 local_1d;
  undefined4 local_1c;
  MutexLock local_18;
  MutexLock l;
  FlagsUsageConfig *default_config;
  
  MutexLock::MutexLock(&local_18,(Mutex *)&(anonymous_namespace)::custom_usage_config_guard);
  if ((anonymous_namespace)::custom_usage_config == (FlagsUsageConfig *)0x0) {
    local_1d = 0;
    FlagsUsageConfig::FlagsUsageConfig(in_RDI);
    local_28 = anon_unknown_0::ContainsHelpshortFlags;
    std::function<bool(std::basic_string_view<char,std::char_traits<char>>)>::operator=
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>)> *)in_RDI,
               &local_28);
    local_30 = anon_unknown_0::ContainsHelppackageFlags;
    std::function<bool(std::basic_string_view<char,std::char_traits<char>>)>::operator=
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>)> *)
               &in_RDI->contains_help_flags,&local_30);
    local_38 = anon_unknown_0::ContainsHelppackageFlags;
    std::function<bool(std::basic_string_view<char,std::char_traits<char>>)>::operator=
              ((function<bool(std::basic_string_view<char,std::char_traits<char>>)> *)
               &in_RDI->contains_helppackage_flags,&local_38);
    local_40 = (anonymous_namespace)::VersionString_abi_cxx11_;
    std::function<std::__cxx11::string()>::operator=
              ((function<std::__cxx11::string()> *)&in_RDI->version_string,&local_40);
    local_48 = (anonymous_namespace)::NormalizeFilename_abi_cxx11_;
    std::function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)>::
    operator=((function<std::__cxx11::string(std::basic_string_view<char,std::char_traits<char>>)> *
              )&in_RDI->normalize_filename,&local_48);
    local_1d = 1;
  }
  else {
    FlagsUsageConfig::FlagsUsageConfig(in_RDI,(anonymous_namespace)::custom_usage_config);
  }
  local_1c = 1;
  MutexLock::~MutexLock(&local_18);
  return in_RDI;
}

Assistant:

FlagsUsageConfig GetUsageConfig() {
  absl::MutexLock l(&custom_usage_config_guard);

  if (custom_usage_config) return *custom_usage_config;

  FlagsUsageConfig default_config;
  default_config.contains_helpshort_flags = &ContainsHelpshortFlags;
  default_config.contains_help_flags = &ContainsHelppackageFlags;
  default_config.contains_helppackage_flags = &ContainsHelppackageFlags;
  default_config.version_string = &VersionString;
  default_config.normalize_filename = &NormalizeFilename;

  return default_config;
}